

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

bool anon_unknown.dwarf_4821::OutputSeekHead
               (Segment *segment,Options *options,FILE *o,Indent *indent)

{
  uint uVar1;
  Indent *pIVar2;
  int iVar3;
  undefined8 uVar4;
  undefined1 local_e0 [40];
  VoidElement *entry_1;
  undefined1 local_b0 [4];
  int i_1;
  undefined8 local_90;
  char *entry_indent;
  Entry *local_68;
  Entry *entry;
  undefined1 local_58 [4];
  int i;
  SeekHead *local_38;
  SeekHead *seekhead;
  Indent *indent_local;
  FILE *o_local;
  Options *options_local;
  Segment *segment_local;
  
  seekhead = (SeekHead *)indent;
  indent_local = (Indent *)o;
  o_local = (FILE *)options;
  options_local = (Options *)segment;
  local_38 = mkvparser::Segment::GetSeekHead(segment);
  pIVar2 = indent_local;
  if (local_38 != (SeekHead *)0x0) {
    libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_58);
    uVar4 = std::__cxx11::string::c_str();
    fprintf((FILE *)pIVar2,"%sSeekHead:",uVar4);
    std::__cxx11::string::~string((string *)local_58);
    if (((byte)o_local[3] & 1) != 0) {
      fprintf((FILE *)indent_local,"  @: %lld",local_38->m_element_start);
    }
    if (((byte)o_local[2] & 1) != 0) {
      fprintf((FILE *)indent_local,"  size: %lld",local_38->m_element_size);
    }
    fprintf((FILE *)indent_local,"\n");
    libwebm::Indent::Adjust((Indent *)seekhead,2);
    for (entry._4_4_ = 0; uVar1 = entry._4_4_, iVar3 = mkvparser::SeekHead::GetCount(local_38),
        (int)uVar1 < iVar3; entry._4_4_ = entry._4_4_ + 1) {
      local_68 = mkvparser::SeekHead::GetEntry(local_38,entry._4_4_);
      pIVar2 = indent_local;
      if (local_68 == (Entry *)0x0) {
        fprintf(_stderr,"Error retrieving SeekHead entry #%d\n",(ulong)entry._4_4_);
        return false;
      }
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)&entry_indent);
      uVar4 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar2,"%sEntry[%d]",uVar4,(ulong)entry._4_4_);
      std::__cxx11::string::~string((string *)&entry_indent);
      if (((byte)o_local[3] & 1) != 0) {
        fprintf((FILE *)indent_local,"  @: %lld",local_68->element_start);
      }
      if (((byte)o_local[2] & 1) != 0) {
        fprintf((FILE *)indent_local,"  size: %lld",local_68->element_size);
      }
      fprintf((FILE *)indent_local,"\n");
      libwebm::Indent::Adjust((Indent *)seekhead,2);
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_b0);
      uVar4 = std::__cxx11::string::c_str();
      std::__cxx11::string::~string((string *)local_b0);
      local_90 = uVar4;
      fprintf((FILE *)indent_local,"%sSeek ID       : %llx\n",uVar4,local_68->id);
      fprintf((FILE *)indent_local,"%sSeek position : %lld\n",local_90,local_68->pos);
      libwebm::Indent::Adjust((Indent *)seekhead,-2);
    }
    for (entry_1._4_4_ = 0; uVar1 = entry_1._4_4_,
        iVar3 = mkvparser::SeekHead::GetVoidElementCount(local_38), (int)uVar1 < iVar3;
        entry_1._4_4_ = entry_1._4_4_ + 1) {
      local_e0._32_8_ = mkvparser::SeekHead::GetVoidElement(local_38,entry_1._4_4_);
      pIVar2 = indent_local;
      if ((VoidElement *)local_e0._32_8_ == (VoidElement *)0x0) {
        fprintf(_stderr,"Error retrieving SeekHead void element #%d\n",(ulong)entry_1._4_4_);
        return false;
      }
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_e0);
      uVar4 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar2,"%sVoid element[%d]",uVar4,(ulong)entry_1._4_4_);
      std::__cxx11::string::~string((string *)local_e0);
      if (((byte)o_local[3] & 1) != 0) {
        fprintf((FILE *)indent_local,"  @: %lld",*(longlong *)local_e0._32_8_);
      }
      if (((byte)o_local[2] & 1) != 0) {
        fprintf((FILE *)indent_local,"  size: %lld",*(longlong *)(local_e0._32_8_ + 8));
      }
      fprintf((FILE *)indent_local,"\n");
    }
    libwebm::Indent::Adjust((Indent *)seekhead,-2);
  }
  return true;
}

Assistant:

bool OutputSeekHead(const mkvparser::Segment& segment, const Options& options,
                    FILE* o, Indent* indent) {
  const mkvparser::SeekHead* const seekhead = segment.GetSeekHead();
  if (!seekhead) {
    // SeekHeads are optional.
    return true;
  }

  fprintf(o, "%sSeekHead:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, "  @: %lld", seekhead->m_element_start);
  if (options.output_size)
    fprintf(o, "  size: %lld", seekhead->m_element_size);
  fprintf(o, "\n");

  indent->Adjust(libwebm::kIncreaseIndent);

  for (int i = 0; i < seekhead->GetCount(); ++i) {
    const mkvparser::SeekHead::Entry* const entry = seekhead->GetEntry(i);
    if (!entry) {
      fprintf(stderr, "Error retrieving SeekHead entry #%d\n", i);
      return false;
    }

    fprintf(o, "%sEntry[%d]", indent->indent_str().c_str(), i);
    if (options.output_offset)
      fprintf(o, "  @: %lld", entry->element_start);
    if (options.output_size)
      fprintf(o, "  size: %lld", entry->element_size);
    fprintf(o, "\n");

    indent->Adjust(libwebm::kIncreaseIndent);
    const char* const entry_indent = indent->indent_str().c_str();
    // TODO(jzern): 1) known ids could be stringified. 2) ids could be
    // reencoded to EBML for ease of lookup.
    fprintf(o, "%sSeek ID       : %llx\n", entry_indent, entry->id);
    fprintf(o, "%sSeek position : %lld\n", entry_indent, entry->pos);
    indent->Adjust(libwebm::kDecreaseIndent);
  }

  for (int i = 0; i < seekhead->GetVoidElementCount(); ++i) {
    const mkvparser::SeekHead::VoidElement* const entry =
        seekhead->GetVoidElement(i);
    if (!entry) {
      fprintf(stderr, "Error retrieving SeekHead void element #%d\n", i);
      return false;
    }

    fprintf(o, "%sVoid element[%d]", indent->indent_str().c_str(), i);
    if (options.output_offset)
      fprintf(o, "  @: %lld", entry->element_start);
    if (options.output_size)
      fprintf(o, "  size: %lld", entry->element_size);
    fprintf(o, "\n");
  }

  indent->Adjust(libwebm::kDecreaseIndent);
  return true;
}